

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

FTextureID __thiscall FTextureManager::PalCheck(FTextureManager *this,FTextureID tex)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  if (!vid_nopalsubstitutions.Value) {
    pNVar2 = (this->PalettedVersions).Nodes + ((this->PalettedVersions).Size - 1 & tex.texnum);
    do {
      pNVar3 = pNVar2;
      if ((pNVar3 == (Node *)0x0) || (pNVar3->Next == (Node *)0x1)) {
        pNVar3 = (Node *)0x0;
        break;
      }
      pNVar2 = pNVar3->Next;
    } while ((pNVar3->Pair).Key != tex.texnum);
    if ((pNVar3 != (Node *)0x0) && (iVar1 = (pNVar3->Pair).Value, iVar1 != 0)) {
      tex.texnum = iVar1;
    }
  }
  return (FTextureID)tex.texnum;
}

Assistant:

FTextureID FTextureManager::PalCheck(FTextureID tex)
{
	if (vid_nopalsubstitutions) return tex;
	int *newtex = PalettedVersions.CheckKey(tex.GetIndex());
	if (newtex == NULL || *newtex == 0) return tex;
	return *newtex;
}